

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O3

void cf2_glyphpath_closeOpenPath(CF2_GlyphPath glyphpath)

{
  if (glyphpath->pathIsOpen != '\0') {
    glyphpath->pathIsClosing = '\x01';
    cf2_glyphpath_lineTo
              (glyphpath,(CF2_F16Dot16)(glyphpath->start).x,(CF2_F16Dot16)(glyphpath->start).y);
    if (glyphpath->elemIsQueued != '\0') {
      cf2_glyphpath_pushPrevElem
                (glyphpath,&glyphpath->hintMap,&glyphpath->offsetStart0,glyphpath->offsetStart1,
                 '\x01');
    }
    glyphpath->moveIsPending = '\x01';
    glyphpath->pathIsOpen = '\0';
    glyphpath->pathIsClosing = '\0';
    glyphpath->elemIsQueued = '\0';
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_glyphpath_closeOpenPath( CF2_GlyphPath  glyphpath )
  {
    if ( glyphpath->pathIsOpen )
    {
      /*
       * A closing line in Character Space line is always generated below
       * with `cf2_glyphPath_lineTo'.  It may be ignored later if it turns
       * out to be zero length in Device Space.
       */
      glyphpath->pathIsClosing = TRUE;

      cf2_glyphpath_lineTo( glyphpath,
                            glyphpath->start.x,
                            glyphpath->start.y );

      /* empty the final element from the queue and close the path */
      if ( glyphpath->elemIsQueued )
        cf2_glyphpath_pushPrevElem( glyphpath,
                                    &glyphpath->hintMap,
                                    &glyphpath->offsetStart0,
                                    glyphpath->offsetStart1,
                                    TRUE );

      /* reset state machine */
      glyphpath->moveIsPending = TRUE;
      glyphpath->pathIsOpen    = FALSE;
      glyphpath->pathIsClosing = FALSE;
      glyphpath->elemIsQueued  = FALSE;
    }
  }